

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall duckdb::Appender::ClearColumns(Appender *this)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  Allocator *allocator_p;
  ColumnDataCollection *this_00;
  pointer this_01;
  vector<duckdb::LogicalType,_true> *__x;
  vector<duckdb::LogicalType,_true> local_40;
  
  BaseAppender::Flush(&this->super_BaseAppender);
  pLVar1 = (this->column_ids).
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->column_ids).super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
      super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar1) {
    (this->column_ids).super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
    super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
  }
  pLVar2 = (this->super_BaseAppender).active_types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (this->super_BaseAppender).active_types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_01 = pLVar2;
  if (pLVar3 != pLVar2) {
    do {
      LogicalType::~LogicalType(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pLVar3);
    (this->super_BaseAppender).active_types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar2;
  }
  BaseAppender::InitializeChunk(&this->super_BaseAppender);
  allocator_p = (this->super_BaseAppender).allocator;
  __x = &(this->super_BaseAppender).active_types;
  if ((this->super_BaseAppender).active_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->super_BaseAppender).active_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __x = &(this->super_BaseAppender).types;
  }
  this_00 = (ColumnDataCollection *)operator_new(0x70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_40,
             &__x->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ColumnDataCollection::ColumnDataCollection(this_00,allocator_p,&local_40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_40);
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)&(this->super_BaseAppender).collection,this_00);
  return;
}

Assistant:

void Appender::ClearColumns() {
	Flush();
	column_ids.clear();
	active_types.clear();

	InitializeChunk();
	collection = make_uniq<ColumnDataCollection>(allocator, GetActiveTypes());
}